

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_fre.cc
# Opt level: O0

void ASN1_item_ex_free(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  long lVar1;
  int iVar2;
  ASN1_TEMPLATE *pAVar3;
  ASN1_VALUE **ppAVar4;
  code *local_88;
  code *local_80;
  ASN1_VALUE **pseqval;
  ASN1_TEMPLATE *seqtt;
  int i_1;
  ASN1_aux_cb *asn1_cb_1;
  ASN1_AUX *aux_1;
  ASN1_EXTERN_FUNCS *ef;
  ASN1_VALUE **pchval;
  ASN1_TEMPLATE *tt;
  int i;
  ASN1_aux_cb *asn1_cb;
  ASN1_AUX *aux;
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  
  if ((pval != (ASN1_VALUE **)0x0) && ((it->itype == '\0' || (*pval != (ASN1_VALUE *)0x0)))) {
    switch(it->itype) {
    case '\0':
      if (it->utype == 0) {
        ASN1_primitive_free(pval,it);
      }
      else {
        ASN1_template_free(pval,(ASN1_TEMPLATE *)it->utype);
      }
      break;
    case '\x01':
      iVar2 = asn1_refcount_dec_and_test_zero((ASN1_VALUE **)pval,(ASN1_ITEM *)it);
      if (iVar2 != 0) {
        if (it->tcount == 0) {
          local_88 = (code *)0x0;
        }
        else {
          local_88 = *(code **)(it->tcount + 0x10);
        }
        if ((local_88 == (code *)0x0) || (iVar2 = (*local_88)(2,pval,it,0), iVar2 != 2)) {
          asn1_enc_free(pval,it);
          seqtt._4_4_ = (int)it->templates;
          while (seqtt._4_4_ = seqtt._4_4_ + -1, -1 < seqtt._4_4_) {
            pAVar3 = asn1_do_adb(pval,(ASN1_TEMPLATE *)(it->utype + (long)seqtt._4_4_ * 0x20),0);
            if (pAVar3 != (ASN1_TEMPLATE *)0x0) {
              ppAVar4 = asn1_get_field_ptr(pval,pAVar3);
              ASN1_template_free(ppAVar4,pAVar3);
            }
          }
          if (local_88 != (code *)0x0) {
            (*local_88)(3,pval,it,0);
          }
          OPENSSL_free(*pval);
          *pval = (ASN1_VALUE *)0x0;
        }
      }
      break;
    case '\x02':
      if (it->tcount == 0) {
        local_80 = (code *)0x0;
      }
      else {
        local_80 = *(code **)(it->tcount + 0x10);
      }
      if ((local_80 == (code *)0x0) || (iVar2 = (*local_80)(2,pval,it,0), iVar2 != 2)) {
        iVar2 = asn1_get_choice_selector(pval,it);
        if ((-1 < iVar2) && ((long)iVar2 < (long)it->templates)) {
          pAVar3 = (ASN1_TEMPLATE *)(it->utype + (long)iVar2 * 0x20);
          ppAVar4 = asn1_get_field_ptr(pval,pAVar3);
          ASN1_template_free(ppAVar4,pAVar3);
        }
        if (local_80 != (code *)0x0) {
          (*local_80)(3,pval,it,0);
        }
        OPENSSL_free(*pval);
        *pval = (ASN1_VALUE *)0x0;
      }
      break;
    case '\x04':
      lVar1 = it->tcount;
      if ((lVar1 != 0) && (*(long *)(lVar1 + 8) != 0)) {
        (**(code **)(lVar1 + 8))(pval,it);
      }
      break;
    case '\x05':
      ASN1_primitive_free(pval,it);
    }
  }
  return;
}

Assistant:

void ASN1_item_ex_free(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  if (!pval) {
    return;
  }
  if ((it->itype != ASN1_ITYPE_PRIMITIVE) && !*pval) {
    return;
  }

  switch (it->itype) {
    case ASN1_ITYPE_PRIMITIVE:
      if (it->templates) {
        ASN1_template_free(pval, it->templates);
      } else {
        ASN1_primitive_free(pval, it);
      }
      break;

    case ASN1_ITYPE_MSTRING:
      ASN1_primitive_free(pval, it);
      break;

    case ASN1_ITYPE_CHOICE: {
      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb) {
        if (asn1_cb(ASN1_OP_FREE_PRE, pval, it, NULL) == 2) {
          return;
        }
      }
      int i = asn1_get_choice_selector(pval, it);
      if ((i >= 0) && (i < it->tcount)) {
        const ASN1_TEMPLATE *tt = it->templates + i;
        ASN1_VALUE **pchval = asn1_get_field_ptr(pval, tt);
        ASN1_template_free(pchval, tt);
      }
      if (asn1_cb) {
        asn1_cb(ASN1_OP_FREE_POST, pval, it, NULL);
      }
      OPENSSL_free(*pval);
      *pval = NULL;
      break;
    }

    case ASN1_ITYPE_EXTERN: {
      const ASN1_EXTERN_FUNCS *ef =
          reinterpret_cast<const ASN1_EXTERN_FUNCS *>(it->funcs);
      if (ef && ef->asn1_ex_free) {
        ef->asn1_ex_free(pval, it);
      }
      break;
    }

    case ASN1_ITYPE_SEQUENCE: {
      if (!asn1_refcount_dec_and_test_zero(pval, it)) {
        return;
      }
      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb) {
        if (asn1_cb(ASN1_OP_FREE_PRE, pval, it, NULL) == 2) {
          return;
        }
      }
      asn1_enc_free(pval, it);
      // If we free up as normal we will invalidate any ANY DEFINED BY
      // field and we wont be able to determine the type of the field it
      // defines. So free up in reverse order.
      for (int i = it->tcount - 1; i >= 0; i--) {
        const ASN1_TEMPLATE *seqtt = asn1_do_adb(pval, &it->templates[i], 0);
        if (!seqtt) {
          continue;
        }
        ASN1_VALUE **pseqval = asn1_get_field_ptr(pval, seqtt);
        ASN1_template_free(pseqval, seqtt);
      }
      if (asn1_cb) {
        asn1_cb(ASN1_OP_FREE_POST, pval, it, NULL);
      }
      OPENSSL_free(*pval);
      *pval = NULL;
      break;
    }
  }
}